

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O3

void Dsd_TreePrint2_rec(FILE *pFile,DdManager *dd,Dsd_Node_t *pNode,int fComp,char **pInputNames)

{
  word *pTruth;
  ushort uVar1;
  bool bVar2;
  DdManager *dd_00;
  char **pInputNames_00;
  uint uVar3;
  uint uVar4;
  DdNode *bFunc;
  ulong uVar5;
  word wVar6;
  int iVar7;
  char *pcVar8;
  word *pwVar9;
  long lVar10;
  long lVar11;
  char pCanonPerm [6];
  word uTruth;
  char local_5e [6];
  DdManager *local_58;
  char **local_50;
  long local_48;
  word local_40 [2];
  
  switch(pNode->Type) {
  case DSD_NODE_CONST1:
    fprintf((FILE *)pFile,"Const%d",(ulong)(fComp == 0));
    return;
  case DSD_NODE_BUF:
    pcVar8 = "!";
    if (fComp == 0) {
      pcVar8 = "";
    }
    fputs(pcVar8,(FILE *)pFile);
    fputs(pInputNames[pNode->S->index],(FILE *)pFile);
    return;
  case DSD_NODE_OR:
    pcVar8 = "";
    if (fComp == 0) {
      pcVar8 = "!";
    }
    fputs(pcVar8,(FILE *)pFile);
    fputc(0x28,(FILE *)pFile);
    if (0 < pNode->nDecs) {
      lVar10 = 0;
      do {
        Dsd_TreePrint2_rec(pFile,dd,(Dsd_Node_t *)((ulong)pNode->pDecs[lVar10] & 0xfffffffffffffffe)
                           ,~(uint)pNode->pDecs[lVar10] & 1,pInputNames);
        lVar10 = lVar10 + 1;
      } while (lVar10 < pNode->nDecs);
    }
    iVar7 = 0x29;
    break;
  case DSD_NODE_EXOR:
    pcVar8 = "!";
    if (fComp == 0) {
      pcVar8 = "";
    }
    fputs(pcVar8,(FILE *)pFile);
    fputc(0x5b,(FILE *)pFile);
    if (0 < pNode->nDecs) {
      lVar10 = 0;
      do {
        Dsd_TreePrint2_rec(pFile,dd,(Dsd_Node_t *)((ulong)pNode->pDecs[lVar10] & 0xfffffffffffffffe)
                           ,(uint)pNode->pDecs[lVar10] & 1,pInputNames);
        lVar10 = lVar10 + 1;
      } while (lVar10 < pNode->nDecs);
    }
    iVar7 = 0x5d;
    break;
  case DSD_NODE_PRIME:
    fputc(0x20,(FILE *)pFile);
    if (6 < pNode->nDecs) {
      fprintf((FILE *)pFile,"|%d|");
      fputc(0x7b,(FILE *)pFile);
      if (0 < pNode->nDecs) {
        lVar10 = 0;
        do {
          Dsd_TreePrint2_rec(pFile,dd,(Dsd_Node_t *)
                                      ((ulong)pNode->pDecs[lVar10] & 0xfffffffffffffffe),
                             (uint)pNode->pDecs[lVar10] & 1,pInputNames);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pNode->nDecs);
      }
      fwrite("} ",2,1,(FILE *)pFile);
      return;
    }
    local_50 = pInputNames;
    bFunc = Dsd_TreeGetPrimeFunction(dd,pNode);
    local_40[1] = Dsd_TreeFunc2Truth_rec(dd,bFunc);
    pTruth = local_40 + 1;
    Cudd_Ref(bFunc);
    local_58 = dd;
    Cudd_RecursiveDeref(dd,bFunc);
    uVar3 = Abc_TtCanonicize(pTruth,(int)pNode->nDecs,local_5e);
    uVar4._0_2_ = pNode->nDecs;
    uVar4._2_2_ = pNode->nVisits;
    pcVar8 = "!";
    if ((uint)((uVar3 >> (uVar4 & 0x1f) & 1) != 0) == fComp) {
      pcVar8 = "";
    }
    fputs(pcVar8,(FILE *)pFile);
    uVar1 = pNode->nDecs;
    if ((short)uVar1 < 2) {
      __assert_fail("nVars >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x4dc,"void Abc_TtPrintHexRev(FILE *, word *, int)");
    }
    lVar10 = 1;
    if (6 < uVar1) {
      lVar10 = (long)(1 << ((char)uVar1 - 6U & 0x1f));
    }
    pwVar9 = local_40 + lVar10;
    if (pTruth <= pwVar9) {
      uVar5 = 0xf;
      if ((short)uVar1 < 6) {
        uVar5 = (ulong)(uint)~(-1 << ((char)uVar1 - 2U & 0x1f));
      }
      local_48 = uVar5 + 1;
      local_40[0] = uVar5 << 2;
      wVar6 = local_40[0];
      lVar10 = local_48;
      do {
        uVar4 = (uint)(*pwVar9 >> ((byte)wVar6 & 0x3c)) & 0xf;
        iVar7 = uVar4 + 0x30;
        if (9 < uVar4) {
          iVar7 = uVar4 + 0x37;
        }
        fputc(iVar7,(FILE *)pFile);
        lVar11 = lVar10 + -1;
        bVar2 = 0 < lVar10;
        wVar6 = wVar6 - 4;
        lVar10 = lVar11;
      } while ((lVar11 != 0 && bVar2) ||
              (pwVar9 = pwVar9 + -1, wVar6 = local_40[0], lVar10 = local_48, pTruth <= pwVar9));
    }
    fputc(0x7b,(FILE *)pFile);
    pInputNames_00 = local_50;
    dd_00 = local_58;
    if (0 < pNode->nDecs) {
      lVar10 = 0;
      do {
        Dsd_TreePrint2_rec(pFile,dd_00,
                           (Dsd_Node_t *)
                           ((ulong)pNode->pDecs[local_5e[lVar10]] & 0xfffffffffffffffe),
                           (uVar3 >> ((byte)lVar10 & 0x1f) ^ (uint)pNode->pDecs[local_5e[lVar10]]) &
                           1,pInputNames_00);
        lVar10 = lVar10 + 1;
      } while (lVar10 < pNode->nDecs);
    }
    fwrite("} ",2,1,(FILE *)pFile);
    return;
  default:
    __assert_fail("pNode->Type == DSD_NODE_BUF || pNode->Type == DSD_NODE_PRIME || pNode->Type == DSD_NODE_OR || pNode->Type == DSD_NODE_EXOR"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/dsd/dsdTree.c"
                  ,0x35d,"void Dsd_TreePrint2_rec(FILE *, DdManager *, Dsd_Node_t *, int, char **)")
    ;
  }
  fputc(iVar7,(FILE *)pFile);
  return;
}

Assistant:

void Dsd_TreePrint2_rec( FILE * pFile, DdManager * dd, Dsd_Node_t * pNode, int fComp, char * pInputNames[] )
{
    int i;
    if ( pNode->Type == DSD_NODE_CONST1 )
    {
        fprintf( pFile, "Const%d", !fComp );
        return;
    }
    assert( pNode->Type == DSD_NODE_BUF || pNode->Type == DSD_NODE_PRIME || pNode->Type == DSD_NODE_OR || pNode->Type == DSD_NODE_EXOR ); 
//    fprintf( pFile, "%s", (fComp ^ (pNode->Type == DSD_NODE_OR))? "!" : "" );
    if ( pNode->Type == DSD_NODE_BUF )
    {
        fprintf( pFile, "%s", fComp? "!" : "" );
        fprintf( pFile, "%s", pInputNames[pNode->S->index] );
    }
    else if ( pNode->Type == DSD_NODE_PRIME )
    {
        fprintf( pFile, " " );
        if ( pNode->nDecs <= 6 )
        {
            char pCanonPerm[6]; int uCanonPhase;
            // compute truth table
            DdNode * bFunc = Dsd_TreeGetPrimeFunction( dd, pNode );  
            word uTruth = Dsd_TreeFunc2Truth_rec( dd, bFunc );
            Cudd_Ref( bFunc );
            Cudd_RecursiveDeref( dd, bFunc );
            // canonicize truth table
            uCanonPhase = Abc_TtCanonicize( &uTruth, pNode->nDecs, pCanonPerm );
            fprintf( pFile, "%s", (fComp ^ ((uCanonPhase >> pNode->nDecs) & 1)) ? "!" : "" );
            Abc_TtPrintHexRev( pFile, &uTruth, pNode->nDecs );
            fprintf( pFile, "{" );
            for ( i = 0; i < pNode->nDecs; i++ )
            {
                Dsd_Node_t * pInput = pNode->pDecs[(int)pCanonPerm[i]];
                Dsd_TreePrint2_rec( pFile, dd, Dsd_Regular(pInput), Dsd_IsComplement(pInput) ^ ((uCanonPhase>>i)&1), pInputNames );
            }
            fprintf( pFile, "} " );
        }
        else
        {
            fprintf( pFile, "|%d|", pNode->nDecs );
            fprintf( pFile, "{" );
            for ( i = 0; i < pNode->nDecs; i++ )
                Dsd_TreePrint2_rec( pFile, dd, Dsd_Regular(pNode->pDecs[i]), Dsd_IsComplement(pNode->pDecs[i]), pInputNames );
            fprintf( pFile, "} " );
        }
    }
    else if ( pNode->Type == DSD_NODE_OR )
    {
        fprintf( pFile, "%s", !fComp? "!" : "" );
        fprintf( pFile, "(" );
        for ( i = 0; i < pNode->nDecs; i++ )
            Dsd_TreePrint2_rec( pFile, dd, Dsd_Regular(pNode->pDecs[i]), !Dsd_IsComplement(pNode->pDecs[i]), pInputNames );
        fprintf( pFile, ")" );
    }
    else if ( pNode->Type == DSD_NODE_EXOR )
    {
        fprintf( pFile, "%s", fComp? "!" : "" );
        fprintf( pFile, "[" );
        for ( i = 0; i < pNode->nDecs; i++ )
            Dsd_TreePrint2_rec( pFile, dd, Dsd_Regular(pNode->pDecs[i]), Dsd_IsComplement(pNode->pDecs[i]), pInputNames );
        fprintf( pFile, "]" );
    }
}